

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::getCommandBufferMutableConfigString
          (CLIntercept *this,cl_uint num_configs,cl_command_buffer_update_type_khr *config_types,
          void **configs,string *str)

{
  uint uVar1;
  key_type *__k;
  undefined8 *puVar2;
  const_iterator cVar3;
  ulong uVar4;
  char *__format;
  key_type p_Var5;
  cl_uint work_dim;
  CLIntercept *this_00;
  long lVar6;
  cl_uint a;
  ulong uVar7;
  long lStackY_1b0;
  undefined4 uVar9;
  undefined8 uVar8;
  string dispatchStr;
  char s [256];
  
  std::__cxx11::string::assign((char *)str);
  if (configs != (void **)0x0 &&
      (config_types != (cl_command_buffer_update_type_khr *)0x0 && num_configs != 0)) {
    for (uVar4 = 0; uVar4 != num_configs; uVar4 = uVar4 + 1) {
      __k = (key_type *)configs[uVar4];
      if (__k == (key_type *)0x0) {
        snprintf(s,0x100,"\n  config %u: NULL!");
LAB_0015de52:
        std::__cxx11::string::append((char *)str);
      }
      else {
        if (config_types[uVar4] != 0) {
          snprintf(s,0x100,"\n  config %u: unknown type %u!");
          goto LAB_0015de52;
        }
        CEnumNameMap::name_command_buffer_update_type_abi_cxx11_
                  (&dispatchStr,&this->m_EnumNameMap,0);
        p_Var5 = *__k;
        snprintf(s,0x100,"\n  config %u: type = %s (%u), command = %p:",uVar4 & 0xffffffff,
                 dispatchStr._M_dataplus._M_p,(ulong)config_types[uVar4],p_Var5);
        uVar9 = (undefined4)((ulong)p_Var5 >> 0x20);
        std::__cxx11::string::~string((string *)&dispatchStr);
        std::__cxx11::string::append((char *)str);
        uVar8 = CONCAT44(uVar9,*(undefined4 *)((long)__k + 0x14));
        snprintf(s,0x100,
                 "\n    num_args = %u, num_svm_args = %u, num_exec_infos = %u, work_dim = %u",
                 (ulong)*(uint *)(__k + 1),(ulong)*(uint *)((long)__k + 0xc),
                 (ulong)*(uint *)(__k + 2),uVar8);
        this_00 = (CLIntercept *)str;
        std::__cxx11::string::append((char *)str);
        uVar1 = *(uint *)(__k + 1);
        if ((uVar1 == 0) || (__k[3] != (key_type)0x0)) {
          lVar6 = 0;
          for (uVar7 = 0; uVar7 < uVar1; uVar7 = uVar7 + 1) {
            p_Var5 = __k[3];
            lStackY_1b0 = *(long *)(p_Var5 + lVar6 + 8);
            puVar2 = *(undefined8 **)(p_Var5 + lVar6 + 0x10);
            if (puVar2 == (undefined8 *)0x0) {
LAB_0015df59:
              uVar1 = *(uint *)(p_Var5 + lVar6);
              __format = "\n      arg %u: arg_index = %u, arg_size = %zu";
            }
            else if (lStackY_1b0 == 4) {
              uVar1 = *(uint *)(p_Var5 + lVar6);
              uVar8 = CONCAT44((int)((ulong)uVar8 >> 0x20),*(undefined4 *)puVar2);
              __format = "\n      arg %u: arg_index = %u, arg_size = %zu, arg_value = 0x%x";
              lStackY_1b0 = 4;
            }
            else {
              if (lStackY_1b0 != 8) goto LAB_0015df59;
              uVar1 = *(uint *)(p_Var5 + lVar6);
              uVar8 = *puVar2;
              __format = "\n      arg %u: arg_index = %u, arg_size = %zu, arg_value = %p";
              lStackY_1b0 = 8;
            }
            snprintf(s,0x100,__format,uVar7 & 0xffffffff,(ulong)uVar1,lStackY_1b0,uVar8);
            this_00 = (CLIntercept *)str;
            std::__cxx11::string::append((char *)str);
            uVar1 = *(uint *)(__k + 1);
            lVar6 = lVar6 + 0x18;
          }
        }
        else {
          snprintf(s,0x100,"\n      error: num_args is %u and arg_list is NULL!");
          this_00 = (CLIntercept *)str;
          std::__cxx11::string::append((char *)str);
        }
        uVar1 = *(uint *)((long)__k + 0xc);
        if ((uVar1 == 0) || (__k[4] != (key_type)0x0)) {
          lVar6 = 0x10;
          for (uVar7 = 0; uVar7 < uVar1; uVar7 = uVar7 + 1) {
            snprintf(s,0x100,"\n      svm arg %u: arg_index = %u, arg_value = %p",uVar7 & 0xffffffff
                     ,(ulong)*(uint *)(__k[4] + lVar6 + -0x10),*(undefined8 *)(__k[4] + lVar6));
            this_00 = (CLIntercept *)str;
            std::__cxx11::string::append((char *)str);
            uVar1 = *(uint *)((long)__k + 0xc);
            lVar6 = lVar6 + 0x18;
          }
        }
        else {
          snprintf(s,0x100,"\n      error: num_svm_args is %u and arg_svm_list is NULL!");
          this_00 = (CLIntercept *)str;
          std::__cxx11::string::append((char *)str);
        }
        uVar1 = *(uint *)(__k + 2);
        if ((uVar1 == 0) || (__k[5] != (key_type)0x0)) {
          lVar6 = 0;
          for (uVar7 = 0; uVar7 < uVar1; uVar7 = uVar7 + 1) {
            p_Var5 = __k[5];
            CEnumNameMap::name_abi_cxx11_
                      (&dispatchStr,&this->m_EnumNameMap,*(cl_int *)(p_Var5 + lVar6));
            snprintf(s,0x100,
                     "\n      exec info %u: param_name = %s (%04X), param_value_size = %zu, param_value = %p"
                     ,uVar7 & 0xffffffff,dispatchStr._M_dataplus._M_p,
                     (ulong)*(uint *)(p_Var5 + lVar6),*(undefined8 *)(p_Var5 + lVar6 + 8),
                     *(undefined4 *)(p_Var5 + lVar6 + 8 + 8));
            std::__cxx11::string::~string((string *)&dispatchStr);
            this_00 = (CLIntercept *)str;
            std::__cxx11::string::append((char *)str);
            uVar1 = *(uint *)(__k + 2);
            lVar6 = lVar6 + 0x18;
          }
        }
        else {
          snprintf(s,0x100,"\n      error: num_exec_infos is %u and exec_info_list is NULL!");
          this_00 = (CLIntercept *)str;
          std::__cxx11::string::append((char *)str);
        }
        p_Var5 = __k[6];
        if (((p_Var5 != (key_type)0x0) || (__k[7] != (key_type)0x0)) || (__k[8] != (key_type)0x0)) {
          work_dim = *(cl_uint *)((long)__k + 0x14);
          if (work_dim == 0) {
            this_00 = (CLIntercept *)&this->m_MutableCommandInfoMap;
            cVar3 = std::
                    _Rb_tree<_cl_mutable_command_khr_*,_std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>,_std::_Select1st<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>,_std::less<_cl_mutable_command_khr_*>,_std::allocator<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>_>
                    ::find(&(this->m_MutableCommandInfoMap)._M_t,__k);
            if (((_Rb_tree_header *)cVar3._M_node ==
                 &(this->m_MutableCommandInfoMap)._M_t._M_impl.super__Rb_tree_header) ||
               (work_dim = *(cl_uint *)&cVar3._M_node[1]._M_left, work_dim == 0)) goto LAB_0015de5d;
            p_Var5 = __k[6];
          }
          dispatchStr._M_dataplus._M_p = (pointer)&dispatchStr.field_2;
          dispatchStr._M_string_length = 0;
          dispatchStr.field_2._M_local_buf[0] = '\0';
          getEnqueueNDRangeKernelArgsString
                    (this_00,work_dim,(size_t *)p_Var5,(size_t *)__k[7],(size_t *)__k[8],
                     &dispatchStr);
          std::__cxx11::string::append((char *)str);
          std::__cxx11::string::append((string *)str);
          std::__cxx11::string::~string((string *)&dispatchStr);
        }
      }
LAB_0015de5d:
    }
  }
  return;
}

Assistant:

void CLIntercept::getCommandBufferMutableConfigString(
    cl_uint num_configs,
    const cl_command_buffer_update_type_khr* config_types,
    const void** configs,
    std::string& str ) const
{
    str = "";

    if( num_configs > 0 && config_types != nullptr && configs != nullptr )
    {
        char s[256];

        for( cl_uint i = 0; i < num_configs; i++ )
        {
            if( configs[i] == nullptr )
            {
                CLI_SPRINTF(s, 256, "\n  config %u: NULL!", i );
                str += s;
            }
            else if( config_types[i] == CL_STRUCTURE_TYPE_MUTABLE_DISPATCH_CONFIG_KHR )
            {
                auto dispatchConfig = (const cl_mutable_dispatch_config_khr*)configs[i];
                CLI_SPRINTF(s, 256, "\n  config %u: type = %s (%u), command = %p:",
                    i,
                    enumName().name_command_buffer_update_type(config_types[i]).c_str(),
                    config_types[i],
                    dispatchConfig->command);
                str += s;

                CLI_SPRINTF(s, 256, "\n    num_args = %u, num_svm_args = %u, num_exec_infos = %u, work_dim = %u",
                    dispatchConfig->num_args,
                    dispatchConfig->num_svm_args,
                    dispatchConfig->num_exec_infos,
                    dispatchConfig->work_dim);
                str += s;

                if( dispatchConfig->num_args != 0 &&
                    dispatchConfig->arg_list == nullptr )
                {
                        CLI_SPRINTF(s, 256, "\n      error: num_args is %u and arg_list is NULL!",
                            dispatchConfig->num_args);
                        str += s;
                }
                else
                {
                    for( cl_uint a = 0; a < dispatchConfig->num_args; a++ )
                    {
                        const cl_mutable_dispatch_arg_khr* arg =
                            &dispatchConfig->arg_list[a];
                        if( ( arg->arg_value != NULL ) &&
                            ( arg->arg_size == sizeof(cl_mem) ) )
                        {
                            cl_mem* pMem = (cl_mem*)arg->arg_value;
                            CLI_SPRINTF(s, 256, "\n      arg %u: arg_index = %u, arg_size = %zu, arg_value = %p",
                                a,
                                arg->arg_index,
                                arg->arg_size,
                                pMem[0] );
                        }
                        else if( ( arg->arg_value != NULL ) &&
                                 ( arg->arg_size == sizeof(cl_uint) ) )
                        {
                            cl_uint*    pData = (cl_uint*)arg->arg_value;
                            CLI_SPRINTF(s, 256, "\n      arg %u: arg_index = %u, arg_size = %zu, arg_value = 0x%x",
                                a,
                                arg->arg_index,
                                arg->arg_size,
                                pData[0]);
                        }
                        else if( ( arg->arg_value != NULL ) &&
                                 ( arg->arg_size == sizeof(cl_ulong) ) )
                        {
                            cl_ulong*   pData = (cl_ulong*)arg->arg_value;
                            CLI_SPRINTF(s, 256, "\n      arg %u: arg_index = %u, arg_size = %zu, arg_value = 0x%" PRIx64,
                                a,
                                arg->arg_index,
                                arg->arg_size,
                                pData[0]);
                        }
                        else
                        {
                            CLI_SPRINTF(s, 256, "\n      arg %u: arg_index = %u, arg_size = %zu",
                                a,
                                arg->arg_index,
                                arg->arg_size);
                        }

                        str += s;
                    }
                }

                if( dispatchConfig->num_svm_args != 0 &&
                    dispatchConfig->arg_svm_list == nullptr )
                {
                        CLI_SPRINTF(s, 256, "\n      error: num_svm_args is %u and arg_svm_list is NULL!",
                            dispatchConfig->num_svm_args);
                        str += s;
                }
                else
                {
                    for( cl_uint a = 0; a < dispatchConfig->num_svm_args; a++ )
                    {
                        const cl_mutable_dispatch_arg_khr* arg =
                            &dispatchConfig->arg_svm_list[a];
                        CLI_SPRINTF(s, 256, "\n      svm arg %u: arg_index = %u, arg_value = %p",
                            a,
                            arg->arg_index,
                            arg->arg_value);
                        str += s;
                    }
                }

                if( dispatchConfig->num_exec_infos != 0 &&
                    dispatchConfig->exec_info_list == nullptr )
                {
                        CLI_SPRINTF(s, 256, "\n      error: num_exec_infos is %u and exec_info_list is NULL!",
                            dispatchConfig->num_exec_infos);
                        str += s;
                }
                else
                {
                    for( cl_uint a = 0; a < dispatchConfig->num_exec_infos; a++ )
                    {
                        const cl_mutable_dispatch_exec_info_khr* info =
                            &dispatchConfig->exec_info_list[a];
                        CLI_SPRINTF(s, 256, "\n      exec info %u: param_name = %s (%04X), param_value_size = %zu, param_value = %p",
                            a,
                            enumName().name(info->param_name).c_str(),
                            info->param_name,
                            info->param_value_size,
                            info->param_value);
                        str += s;
                    }
                }

                if( dispatchConfig->global_work_offset != nullptr ||
                    dispatchConfig->global_work_size != nullptr ||
                    dispatchConfig->local_work_size != nullptr )
                {
                    cl_uint work_dim = dispatchConfig->work_dim;
                    if( work_dim == 0 )
                    {
                        // TODO: lock?
                        auto iter = m_MutableCommandInfoMap.find(
                            dispatchConfig->command);
                        if( iter != m_MutableCommandInfoMap.end() )
                        {
                            work_dim = iter->second.WorkDim;
                        }
                    }
                    if( work_dim != 0 )
                    {
                        std::string dispatchStr;
                        getEnqueueNDRangeKernelArgsString(
                            work_dim,
                            dispatchConfig->global_work_offset,
                            dispatchConfig->global_work_size,
                            dispatchConfig->local_work_size,
                            dispatchStr);
                        str += "\n      ";
                        str += dispatchStr;
                    }
                }
            }
            else
            {
                CLI_SPRINTF(s, 256, "\n  config %u: unknown type %u!",
                    i,
                    config_types[i] );
                str += s;
            }
        }
    }
}